

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

int xmlBufSetInputBaseCur(xmlBufPtr buf,xmlParserInputPtr input,size_t base,size_t cur)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  
  if (input != (xmlParserInputPtr)0x0) {
    if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
      pxVar5 = "";
      input->end = "";
      input->cur = "";
      iVar1 = -1;
      lVar3 = 0x18;
    }
    else {
      uVar2 = (ulong)buf->compat_size;
      if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
        buf->size = uVar2;
      }
      uVar2 = (ulong)buf->compat_use;
      if ((uVar2 < 0x7fffffff) && (buf->use != uVar2)) {
        buf->use = uVar2;
      }
      pxVar5 = buf->content;
      pxVar4 = pxVar5 + base;
      input->base = pxVar4;
      input->cur = pxVar4 + cur;
      pxVar5 = pxVar5 + buf->use;
      iVar1 = 0;
      lVar3 = 0x28;
    }
    *(xmlChar **)((long)&input->buf + lVar3) = pxVar5;
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlBufSetInputBaseCur(xmlBufPtr buf, xmlParserInputPtr input,
                      size_t base, size_t cur) {
    if (input == NULL)
        return(-1);
    if ((buf == NULL) || (buf->error)) {
        input->base = input->cur = input->end = BAD_CAST "";
        return(-1);
    }
    CHECK_COMPAT(buf)
    input->base = &buf->content[base];
    input->cur = input->base + cur;
    input->end = &buf->content[buf->use];
    return(0);
}